

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O3

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<float,-1,8,0,-1,8>,Eigen::Matrix<float,-1,1,0,8,1>,1>::
applyThisOnTheLeft<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,1,1,1,1,1>>
          (HouseholderSequence<Eigen::Matrix<float,_1,8,0,_1,8>,Eigen::Matrix<float,_1,1,0,8,1>,1>
           *this,Matrix<float,__1,_1,_0,__1,_1> *dst,Matrix<float,_1,_1,_1,_1,_1> *workspace,
          bool inputIsIdentity)

{
  HouseholderSequence<Eigen::Matrix<float,_1,8,0,_1,8>,Eigen::Matrix<float,_1,1,0,8,1>,1> HVar1;
  float *pfVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  float *local_a0;
  ulong local_98;
  ulong local_90;
  Matrix<float,__1,_1,_0,__1,_1> *local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  EssentialVectorType local_68;
  
  lVar7 = *(long *)(this + 0x18);
  if (0 < lVar7) {
    HVar1 = this[0x10];
    lVar5 = -1;
    lVar8 = 0;
    do {
      lVar7 = lVar7 + lVar5;
      if (this[0x10] !=
          (HouseholderSequence<Eigen::Matrix<float,_1,8,0,_1,8>,Eigen::Matrix<float,_1,1,0,8,1>,1>)
          0x0) {
        lVar7 = lVar8;
      }
      local_98 = *(long *)(*(long *)this + 8) - (*(long *)(this + 0x20) + lVar7);
      local_90 = 1;
      if ((((byte)HVar1 ^ 1) & inputIsIdentity) != 0) {
        local_90 = local_98;
      }
      pfVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      lVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      uVar6 = lVar3 - local_98;
      uVar4 = 1 - local_90;
      local_a0 = pfVar2 + uVar6 + lVar3 * uVar4;
      if ((long)(local_90 | local_98) < 0 && pfVar2 != (float *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<float, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, 1>>, Level = 0]"
                     );
      }
      local_88 = dst;
      local_80 = uVar6;
      local_78 = uVar4;
      local_70 = lVar3;
      if (((long)(local_98 | uVar6) < 0) || ((long)(uVar4 | local_90) < 0)) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Matrix<float, -1, 1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, 1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      HouseholderSequence<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_Eigen::Matrix<float,_-1,_1,_0,_8,_1>,_1>
      ::essentialVector(&local_68,
                        (HouseholderSequence<Eigen::Matrix<float,__1,_8,_0,__1,_8>,_Eigen::Matrix<float,__1,_1,_0,_8,_1>,_1>
                         *)this,lVar7);
      MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,-1,-1,false>>::
      applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>const,_1,1,false>>
                ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>> *)&local_a0
                 ,&local_68,(Scalar *)(lVar7 * 4 + *(long *)(this + 8)),(Scalar *)workspace);
      lVar8 = lVar8 + 1;
      lVar7 = *(long *)(this + 0x18);
      lVar5 = lVar5 + -1;
    } while (lVar8 < lVar7);
  }
  return;
}

Assistant:

inline void applyThisOnTheLeft(Dest& dst, Workspace& workspace, bool inputIsIdentity = false) const
    {
      if(inputIsIdentity && m_reverse)
        inputIsIdentity = false;
      // if the entries are large enough, then apply the reflectors by block
      if(m_length>=BlockSize && dst.cols()>1)
      {
        // Make sure we have at least 2 useful blocks, otherwise it is point-less:
        Index blockSize = m_length<Index(2*BlockSize) ? (m_length+1)/2 : Index(BlockSize);
        for(Index i = 0; i < m_length; i+=blockSize)
        {
          Index end = m_reverse ? (std::min)(m_length,i+blockSize) : m_length-i;
          Index k = m_reverse ? i : (std::max)(Index(0),end-blockSize);
          Index bs = end-k;
          Index start = k + m_shift;

          typedef Block<typename internal::remove_all<VectorsType>::type,Dynamic,Dynamic> SubVectorsType;
          SubVectorsType sub_vecs1(m_vectors.const_cast_derived(), Side==OnTheRight ? k : start,
                                                                   Side==OnTheRight ? start : k,
                                                                   Side==OnTheRight ? bs : m_vectors.rows()-start,
                                                                   Side==OnTheRight ? m_vectors.cols()-start : bs);
          typename internal::conditional<Side==OnTheRight, Transpose<SubVectorsType>, SubVectorsType&>::type sub_vecs(sub_vecs1);

          Index dstStart = dst.rows()-rows()+m_shift+k;
          Index dstRows  = rows()-m_shift-k;
          Block<Dest,Dynamic,Dynamic> sub_dst(dst,
                                              dstStart,
                                              inputIsIdentity ? dstStart : 0,
                                              dstRows,
                                              inputIsIdentity ? dstRows : dst.cols());
          apply_block_householder_on_the_left(sub_dst, sub_vecs, m_coeffs.segment(k, bs), !m_reverse);
        }
      }
      else
      {
        workspace.resize(dst.cols());
        for(Index k = 0; k < m_length; ++k)
        {
          Index actual_k = m_reverse ? k : m_length-k-1;
          Index dstStart = rows()-m_shift-actual_k;
          dst.bottomRightCorner(dstStart, inputIsIdentity ? dstStart : dst.cols())
            .applyHouseholderOnTheLeft(essentialVector(actual_k), m_coeffs.coeff(actual_k), workspace.data());
        }
      }
    }